

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeIncrMergerNew(SortSubtask *pTask,MergeEngine *pMerger,IncrMerger **ppOut)

{
  i64 *piVar1;
  int iVar2;
  int iVar3;
  IncrMerger *pIVar4;
  
  if ((sqlite3Config.xTestCallback == (_func_int_int *)0x0) ||
     (iVar2 = (*sqlite3Config.xTestCallback)(100), iVar2 == 0)) {
    pIVar4 = (IncrMerger *)sqlite3MallocZero(0x48);
    *ppOut = pIVar4;
    if (pIVar4 != (IncrMerger *)0x0) {
      pIVar4->pMerger = pMerger;
      pIVar4->pTask = pTask;
      iVar2 = pTask->pSorter->mxKeysize + 9;
      iVar3 = pTask->pSorter->mxPmaSize / 2;
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
      pIVar4->mxSz = iVar2;
      piVar1 = &(pTask->file2).iEof;
      *piVar1 = *piVar1 + (long)iVar2;
      return 0;
    }
  }
  else {
    *ppOut = (IncrMerger *)0x0;
  }
  vdbeMergeEngineFree(pMerger);
  return 7;
}

Assistant:

static int vdbeIncrMergerNew(
  SortSubtask *pTask,     /* The thread that will be using the new IncrMerger */
  MergeEngine *pMerger,   /* The MergeEngine that the IncrMerger will control */
  IncrMerger **ppOut      /* Write the new IncrMerger here */
){
  int rc = SQLITE_OK;
  IncrMerger *pIncr = *ppOut = (IncrMerger*)
       (sqlite3FaultSim(100) ? 0 : sqlite3MallocZero(sizeof(*pIncr)));
  if( pIncr ){
    pIncr->pMerger = pMerger;
    pIncr->pTask = pTask;
    pIncr->mxSz = MAX(pTask->pSorter->mxKeysize+9,pTask->pSorter->mxPmaSize/2);
    pTask->file2.iEof += pIncr->mxSz;
  }else{
    vdbeMergeEngineFree(pMerger);
    rc = SQLITE_NOMEM_BKPT;
  }
  assert( *ppOut!=0 || rc!=SQLITE_OK );
  return rc;
}